

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::get_scalar
          (Animatable<std::vector<int,_std::allocator<int>_>_> *this,
          vector<int,_std::allocator<int>_> *v)

{
  if (((v != (vector<int,_std::allocator<int>_> *)0x0) && (this->_blocked == false)) &&
     (this->_has_value == true)) {
    ::std::vector<int,_std::allocator<int>_>::operator=(v,&this->_value);
    return true;
  }
  return false;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }